

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileDescriptorSet::Clear(FileDescriptorSet *this)

{
  uint32_t cached_has_bits;
  FileDescriptorSet *this_local;
  
  internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  RepeatedPtrField<google::protobuf::FileDescriptorProto>::Clear(&(this->field_0)._impl_.file_);
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void FileDescriptorSet::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FileDescriptorSet)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  _impl_.file_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}